

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

void __thiscall CommentTokenizerRule::~CommentTokenizerRule(CommentTokenizerRule *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (reader->charAt(i) != '#') {
      return std::make_pair(false, 0);
    }

    i++;

    while (reader->charAt(i) != '\0' && reader->charAt(i) != '\n' && reader->charAt(i) != '\r') {
      i++;
    }

    return std::make_pair(true, i);
  }